

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Base.cpp
# Opt level: O0

size_t __thiscall
adios2::format::BP4Base::GetBPIndexSizeInData(BP4Base *this,string *variableName,Dims *count)

{
  long lVar1;
  long lVar2;
  size_type elementSize;
  size_t sVar3;
  Dims *dimensions_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  long *in_RDI;
  size_t nSubblocks;
  size_t nElems;
  size_t dimensions;
  size_t indexSize;
  
  lVar1 = 0x3b;
  lVar2 = std::__cxx11::string::size();
  lVar2 = lVar2 + lVar1;
  elementSize = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDX);
  lVar2 = elementSize * 0x1c + lVar2;
  lVar1 = lVar2 + 0x13;
  if (elementSize == 1) {
    lVar1 = lVar2 + 0x25;
  }
  dimensions_00 = (Dims *)(lVar1 + 5);
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x22c) == 1) {
    sVar3 = helper::GetTotalSize(dimensions_00,elementSize);
    dimensions_00 =
         (Dims *)((long)dimensions_00 +
                 elementSize * 2 +
                 (sVar3 / *(ulong *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x218) + 1) * 0x22
                 + 3);
  }
  return (long)dimensions_00 + elementSize * 0x1c + 0x11;
}

Assistant:

size_t BP4Base::GetBPIndexSizeInData(const std::string &variableName,
                                     const Dims &count) const noexcept
{
    size_t indexSize = 23; // header
    indexSize += 4 + 32;   // "[VMD" and padded " *VMD]" up to 31 char length
    indexSize += variableName.size();

    // characteristics 3 and 4, check variable number of dimensions
    const size_t dimensions = count.size();
    indexSize += 28 * dimensions; // 28 bytes per dimension
    indexSize += 1;               // id

    // characteristics, offset + payload offset in data
    indexSize += 2 * (1 + 8);
    // characteristic 0, if scalar add value, for now only allowing string
    if (dimensions == 1)
    {
        indexSize += 2 * sizeof(uint64_t); // complex largest size
        indexSize += 1;                    // id
        indexSize += 1;                    // id
    }

    // characteristic statistics
    indexSize += 5;                   // count + length
    if (m_Parameters.StatsLevel == 1) // default, only min and max and dimensions
    {
        const size_t nElems = helper::GetTotalSize(count);
        const size_t nSubblocks = nElems / m_Parameters.StatsBlockSize;
        indexSize += 2 * (nSubblocks + 1) * (2 * sizeof(uint64_t) + 1);
        indexSize += dimensions * 2;
        indexSize += 1 + 2; // id + # of subblocks field
    }
    // dimensions
    indexSize += 28 * dimensions + 1;

    // extra 12 bytes for attributes in case of last variable
    // extra 4 bytes for PGI] in case of last variable
    return indexSize + 12 + 4;
}